

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O2

void __thiscall Rml::Element::ProcessDefaultAction(Element *this,Event *event)

{
  Dictionary *dictionary;
  bool bVar1;
  EventId EVar2;
  int iVar3;
  EventPhase EVar4;
  String SStack_98;
  allocator<char> local_76;
  allocator<char> local_75;
  float local_74;
  String local_70;
  float local_4c;
  float local_48;
  float local_38;
  
  bVar1 = Event::operator==(event,Mousedown);
  if (bVar1) {
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&SStack_98,"mouse_x",&local_75);
    local_74 = 0.0;
    dictionary = &event->parameters;
    local_38 = Get<float>(dictionary,&SStack_98,&local_74);
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"mouse_y",&local_76);
    local_4c = 0.0;
    local_48 = Get<float>(dictionary,&local_70,&local_4c);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::__cxx11::string::~string((string *)&SStack_98);
    iVar3 = (*(this->super_ScriptInterface).super_Releasable._vptr_Releasable[7])(local_38,this);
    if ((char)iVar3 != '\0') {
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&SStack_98,"button",(allocator<char> *)&local_74);
      local_70._M_dataplus._M_p._0_4_ = 0;
      iVar3 = Get<int>(dictionary,&SStack_98,(int *)&local_70);
      ::std::__cxx11::string::~string((string *)&SStack_98);
      if (iVar3 == 0) {
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&SStack_98,"active",(allocator<char> *)&local_70);
        SetPseudoClass(this,&SStack_98,true);
        ::std::__cxx11::string::~string((string *)&SStack_98);
      }
    }
  }
  EVar4 = Event::GetPhase(event);
  if (EVar4 == Target) {
    EVar2 = Event::GetId(event);
    switch(EVar2) {
    case Mouseover:
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&SStack_98,"hover",(allocator<char> *)&local_70);
      SetPseudoClass(this,&SStack_98,true);
      break;
    case Mouseout:
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&SStack_98,"hover",(allocator<char> *)&local_70);
      SetPseudoClass(this,&SStack_98,false);
      break;
    case Focus:
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&SStack_98,"focus",(allocator<char> *)&local_70);
      SetPseudoClass(this,&SStack_98,true);
      ::std::__cxx11::string::~string((string *)&SStack_98);
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&SStack_98,"focus_visible",(allocator<char> *)&local_70);
      local_74 = (float)((uint)local_74 & 0xffffff00);
      bVar1 = Get<bool>(&event->parameters,&SStack_98,(bool *)&local_74);
      ::std::__cxx11::string::~string((string *)&SStack_98);
      if (!bVar1) {
        return;
      }
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&SStack_98,"focus-visible",(allocator<char> *)&local_70);
      SetPseudoClass(this,&SStack_98,true);
      break;
    case Blur:
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&SStack_98,"focus",(allocator<char> *)&local_70);
      SetPseudoClass(this,&SStack_98,false);
      ::std::__cxx11::string::~string((string *)&SStack_98);
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&SStack_98,"focus-visible",(allocator<char> *)&local_70);
      SetPseudoClass(this,&SStack_98,false);
      break;
    default:
      goto switchD_00283445_default;
    }
    ::std::__cxx11::string::~string((string *)&SStack_98);
  }
switchD_00283445_default:
  return;
}

Assistant:

void Element::ProcessDefaultAction(Event& event)
{
	if (event == EventId::Mousedown)
	{
		const Vector2f mouse_pos(event.GetParameter("mouse_x", 0.f), event.GetParameter("mouse_y", 0.f));

		if (IsPointWithinElement(mouse_pos) && event.GetParameter("button", 0) == 0)
			SetPseudoClass("active", true);
	}

	if (event.GetPhase() == EventPhase::Target)
	{
		switch (event.GetId())
		{
		case EventId::Mouseover: SetPseudoClass("hover", true); break;
		case EventId::Mouseout: SetPseudoClass("hover", false); break;
		case EventId::Focus:
			SetPseudoClass("focus", true);
			if (event.GetParameter("focus_visible", false))
				SetPseudoClass("focus-visible", true);
			break;
		case EventId::Blur:
			SetPseudoClass("focus", false);
			SetPseudoClass("focus-visible", false);
			break;
		default: break;
		}
	}
}